

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O0

size_type __thiscall
lf::assemble::DynamicFEDofHandler::NumInteriorDofs(DynamicFEDofHandler *this,Entity *entity)

{
  int iVar1;
  dim_t dVar2;
  uint uVar3;
  element_type *peVar4;
  const_reference this_00;
  const_reference pvVar5;
  size_type no_loc_dofs;
  glb_idx_t entity_index;
  dim_t codim;
  RefEl ref_el_type;
  Entity *entity_local;
  DynamicFEDofHandler *this_local;
  
  _codim = entity;
  iVar1 = (*entity->_vptr_Entity[4])();
  entity_index._3_1_ = (undefined1)iVar1;
  dVar2 = lf::base::RefEl::Dimension((RefEl *)((long)&entity_index + 3));
  peVar4 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  uVar3 = (*peVar4->_vptr_Mesh[5])(peVar4,_codim);
  this_00 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                      (&this->num_int_dofs_,(ulong)(2 - dVar2));
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_00,(ulong)uVar3);
  return *pvVar5;
}

Assistant:

size_type DynamicFEDofHandler::NumInteriorDofs(
    const lf::mesh::Entity &entity) const {
  const lf::base::RefEl ref_el_type = entity.RefEl();
  const dim_t codim = 2 - ref_el_type.Dimension();
  const glb_idx_t entity_index = mesh_p_->Index(entity);
  const size_type no_loc_dofs = num_int_dofs_[codim][entity_index];
  return no_loc_dofs;
}